

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int fits_get_cwd(char *cwd,int *status)

{
  char *pcVar1;
  char local_428 [8];
  char buff [1025];
  int *status_local;
  char *cwd_local;
  
  if (*status == 0) {
    unique0x10000067 = status;
    pcVar1 = getcwd(local_428,0x401);
    if (pcVar1 == (char *)0x0) {
      *cwd = '\0';
      ffpmsg("Path and file name too long (fits_get_cwd)");
      *stack0xffffffffffffffe0 = 0x7d;
      cwd_local._4_4_ = 0x7d;
    }
    else {
      fits_path2url(local_428,0x401,cwd,stack0xffffffffffffffe0);
      cwd_local._4_4_ = *stack0xffffffffffffffe0;
    }
  }
  else {
    cwd_local._4_4_ = *status;
  }
  return cwd_local._4_4_;
}

Assistant:

int fits_get_cwd(char *cwd,  /* IO current working directory string */
		 int  *status)
  /*
     retrieve the string containing the current working directory absolute
     path in Unix-like URL standard notation. It is assumed that the CWD
     string has a size of at least FLEN_FILENAME.

     Note that this process is platform dependent. This
     function supports Unix, MSDOS/WIN32, VMS and Macintosh platforms. Each
     platform dependent code segment is conditionally compiled depending 
     upon the setting of the appropriate C preprocesser macros.
   */
{

  char buff[FLEN_FILENAME];


  if(*status != 0) return(*status);

#if defined(macintosh)

  /*
     MacOS case. Currently unknown !!!!
  */

  *buff = 0;

#else
  /*
    Good old getcwd() seems to work with all other platforms
  */

  if (!getcwd(buff,FLEN_FILENAME))
  {
     cwd[0]=0;
     ffpmsg("Path and file name too long (fits_get_cwd)");
     return (*status=URL_PARSE_ERROR);
  }

#endif

  /*
    convert the cwd string to a URL standard path string
  */

  fits_path2url(buff,FLEN_FILENAME,cwd,status);

  return(*status);
}